

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::AdvancedSwitchPrograms::Setup(AdvancedSwitchPrograms *this)

{
  CallLogWrapper *this_00;
  
  this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  this->m_storage_buffer[0] = 0;
  this->m_storage_buffer[1] = 0;
  this->m_storage_buffer[2] = 0;
  this->m_storage_buffer[3] = 0;
  this->m_program[0] = 0;
  this->m_program[1] = 0;
  this->m_program[2] = 0;
  this->m_program[3] = 0;
  this->m_vertex_array = 0;
  glu::CallLogWrapper::glGenFramebuffers(this_00,1,&this->m_fbo);
  glu::CallLogWrapper::glGenTextures(this_00,1,&this->m_rt);
  return 0;
}

Assistant:

virtual long Setup()
	{
		memset(m_program, 0, sizeof(m_program));
		memset(m_storage_buffer, 0, sizeof(m_storage_buffer));
		m_vertex_array = 0;
		glGenFramebuffers(1, &m_fbo);
		glGenTextures(1, &m_rt);
		return NO_ERROR;
	}